

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Quat rw::slerp(Quat *q,Quat *p,float32 a)

{
  float fVar1;
  Quat QVar2;
  Quat local_78;
  Quat local_68;
  float local_58;
  float local_54;
  float32 s;
  float32 phi;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  Quat q1;
  float32 c;
  float32 a_local;
  Quat *p_local;
  Quat *q_local;
  float32 local_10;
  float32 fStack_c;
  
  local_40 = *(undefined1 (*) [8])q;
  q1.x = q->z;
  q1.y = q->w;
  q1.w = a;
  q1.z = dot((Quat *)local_40,p);
  if ((float)q1.z < 0.0) {
    q1.z = (float32)-(float)q1.z;
    QVar2 = negate((Quat *)local_40);
    _s = QVar2._0_8_;
    local_48 = QVar2._8_8_;
    local_40 = (undefined1  [8])_s;
    q1._0_8_ = local_48;
  }
  local_54 = acosf((float)q1.z);
  if (local_54 <= 1e-05) {
    q_local = (Quat *)local_40;
    local_10 = q1.x;
    fStack_c = q1.y;
  }
  else {
    local_58 = sinf(local_54);
    fVar1 = sinf((1.0 - (float)q1.w) * local_54);
    QVar2 = scale((Quat *)local_40,(float32)(fVar1 / local_58));
    local_68._0_8_ = QVar2._0_8_;
    local_68._8_8_ = QVar2._8_8_;
    fVar1 = sinf((float)q1.w * local_54);
    QVar2 = scale(p,(float32)(fVar1 / local_58));
    local_78._0_8_ = QVar2._0_8_;
    local_78._8_8_ = QVar2._8_8_;
    QVar2 = add(&local_68,&local_78);
    q_local = QVar2._0_8_;
    _local_10 = QVar2._8_8_;
  }
  QVar2.z = local_10;
  QVar2.w = fStack_c;
  QVar2._0_8_ = q_local;
  return QVar2;
}

Assistant:

Quat
slerp(const Quat &q, const Quat &p, float32 a)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	float32 phi = acosf(c);
	if(phi > 0.00001f){
		float32 s = sinf(phi);
		return add(scale(q1, sinf((1.0f-a)*phi)/s),
		           scale(p,  sinf(a*phi)/s));
	}
	return q1;
}